

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void InitIo(VP8Decoder *dec,VP8Io *io)

{
  VP8Io *io_local;
  VP8Decoder *dec_local;
  
  io->mb_y = 0;
  io->y = dec->cache_y;
  io->u = dec->cache_u;
  io->v = dec->cache_v;
  io->y_stride = dec->cache_y_stride;
  io->uv_stride = dec->cache_uv_stride;
  io->a = (uint8_t *)0x0;
  return;
}

Assistant:

static void InitIo(VP8Decoder* const dec, VP8Io* io) {
  // prepare 'io'
  io->mb_y = 0;
  io->y = dec->cache_y;
  io->u = dec->cache_u;
  io->v = dec->cache_v;
  io->y_stride = dec->cache_y_stride;
  io->uv_stride = dec->cache_uv_stride;
  io->a = NULL;
}